

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

void bsPutUInt32(EState *s,UInt32 u)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  UInt32 UVar5;
  
  if (s->bsLive < 8) {
    uVar2 = s->bsBuff;
    iVar4 = s->bsLive + 8;
  }
  else {
    uVar2 = s->bsBuff;
    iVar3 = s->numZ;
    do {
      s->zbits[iVar3] = (UChar)(uVar2 >> 0x18);
      iVar3 = s->numZ + 1;
      s->numZ = iVar3;
      uVar2 = s->bsBuff << 8;
      s->bsBuff = uVar2;
      iVar4 = s->bsLive;
      s->bsLive = iVar4 + -8;
    } while (0xf < iVar4);
  }
  uVar2 = (u >> 0x18) << (-(char)iVar4 & 0x1fU) | uVar2;
  s->bsBuff = uVar2;
  s->bsLive = iVar4;
  if (7 < iVar4) {
    iVar3 = s->numZ;
    do {
      s->zbits[iVar3] = (UChar)(uVar2 >> 0x18);
      iVar3 = s->numZ + 1;
      s->numZ = iVar3;
      uVar2 = s->bsBuff << 8;
      s->bsBuff = uVar2;
      iVar1 = s->bsLive;
      iVar4 = iVar1 + -8;
      s->bsLive = iVar4;
    } while (0xf < iVar1);
  }
  iVar3 = iVar4 + 8;
  UVar5 = (u >> 0x10 & 0xff) << (0x18U - (char)iVar4 & 0x1f) | uVar2;
  s->bsBuff = UVar5;
  s->bsLive = iVar3;
  if (-1 < iVar4) {
    iVar4 = s->numZ;
    do {
      s->zbits[iVar4] = (UChar)(UVar5 >> 0x18);
      iVar4 = s->numZ + 1;
      s->numZ = iVar4;
      UVar5 = s->bsBuff << 8;
      s->bsBuff = UVar5;
      iVar1 = s->bsLive;
      iVar3 = iVar1 + -8;
      s->bsLive = iVar3;
    } while (0xf < iVar1);
  }
  iVar4 = iVar3 + 8;
  uVar2 = (u >> 8 & 0xff) << (0x18U - (char)iVar3 & 0x1f) | UVar5;
  s->bsBuff = uVar2;
  s->bsLive = iVar4;
  if (-1 < iVar3) {
    iVar3 = s->numZ;
    do {
      s->zbits[iVar3] = (UChar)(uVar2 >> 0x18);
      iVar3 = s->numZ + 1;
      s->numZ = iVar3;
      uVar2 = s->bsBuff << 8;
      s->bsBuff = uVar2;
      iVar1 = s->bsLive;
      iVar4 = iVar1 + -8;
      s->bsLive = iVar4;
    } while (0xf < iVar1);
  }
  s->bsBuff = (u & 0xff) << (0x18U - (char)iVar4 & 0x1f) | uVar2;
  s->bsLive = iVar4 + 8;
  return;
}

Assistant:

static
void bsPutUInt32 ( EState* s, UInt32 u )
{
   bsW ( s, 8, (u >> 24) & 0xffL );
   bsW ( s, 8, (u >> 16) & 0xffL );
   bsW ( s, 8, (u >>  8) & 0xffL );
   bsW ( s, 8,  u        & 0xffL );
}